

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openxr_program.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_5b5eb::OpenXrProgram::InitializeSession(OpenXrProgram *this)

{
  XrSession *ppXVar1;
  array<unsigned_long,_2UL> *paVar2;
  XrReferenceSpaceType *pXVar3;
  int iVar4;
  XrResult XVar5;
  uint uVar6;
  undefined4 extraout_var;
  char *pcVar7;
  long lVar8;
  string *referenceSpaceTypeStr;
  XrReferenceSpaceType *pXVar9;
  initializer_list<XrActionSuggestedBinding> __l;
  initializer_list<XrActionSuggestedBinding> __l_00;
  initializer_list<XrActionSuggestedBinding> __l_01;
  initializer_list<XrActionSuggestedBinding> __l_02;
  initializer_list<XrActionSuggestedBinding> __l_03;
  allocator_type local_241;
  XrPath khrSimpleInteractionProfilePath;
  vector<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_> spaces;
  array<unsigned_long,_2UL> hapticPath;
  array<unsigned_long,_2UL> posePath;
  array<unsigned_long,_2UL> menuClickPath;
  array<unsigned_long,_2UL> squeezeValuePath;
  array<unsigned_long,_2UL> squeezeClickPath;
  array<unsigned_long,_2UL> squeezeForcePath;
  uint32_t spaceCount;
  XrSystemId local_190 [3];
  array<unsigned_long,_2UL> triggerValuePath;
  array<unsigned_long,_2UL> bClickPath;
  XrSessionCreateInfo createInfo;
  XrAction local_138;
  unsigned_long uStack_130;
  XrAction local_128;
  unsigned_long uStack_120;
  XrAction local_118;
  unsigned_long uStack_110;
  undefined8 local_108;
  array<unsigned_long,_2UL> *local_100;
  XrAction local_f8;
  unsigned_long local_f0;
  XrAction local_e8;
  unsigned_long local_e0;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [40];
  string local_70;
  string local_50;
  
  if (this->m_instance == (XrInstance)0x0) {
    std::__cxx11::string::string((string *)&local_50,"Check failed",(allocator *)&createInfo);
    Throw(&local_50,"m_instance != XR_NULL_HANDLE",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:553"
         );
  }
  if (this->m_session != (XrSession)0x0) {
    std::__cxx11::string::string((string *)&local_70,"Check failed",(allocator *)&createInfo);
    Throw(&local_70,"m_session == XR_NULL_HANDLE",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:554"
         );
  }
  Fmt_abi_cxx11_((string *)&createInfo,"Creating session...");
  Log::Write(Verbose,(string *)&createInfo);
  ppXVar1 = &this->m_session;
  std::__cxx11::string::~string((string *)&createInfo);
  createInfo.createFlags = 0;
  createInfo.systemId = 0;
  createInfo.type = XR_TYPE_SESSION_CREATE_INFO;
  createInfo._4_4_ = 0;
  createInfo.next = (void *)0x0;
  iVar4 = (*((this->m_graphicsPlugin).
             super___shared_ptr<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_IGraphicsPlugin[5])();
  createInfo.next = (void *)CONCAT44(extraout_var,iVar4);
  createInfo.systemId = this->m_systemId;
  XVar5 = xrCreateSession(this->m_instance,&createInfo,ppXVar1);
  CheckXrResult(XVar5,"xrCreateSession(m_instance, &createInfo, &m_session)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:562"
               );
  if (this->m_session == (XrSession)0x0) {
    std::__cxx11::string::string((string *)&createInfo,"Check failed",(allocator *)&spaces);
    Throw((string *)&createInfo,"m_session != XR_NULL_HANDLE",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:318"
         );
  }
  XVar5 = xrEnumerateReferenceSpaces(this->m_session,0,&spaceCount,0);
  CheckXrResult(XVar5,"xrEnumerateReferenceSpaces(m_session, 0, &spaceCount, nullptr)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:321"
               );
  std::vector<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>::vector
            (&spaces,(ulong)spaceCount,(allocator_type *)&createInfo);
  XVar5 = xrEnumerateReferenceSpaces
                    (*ppXVar1,spaceCount,&spaceCount,
                     CONCAT44(spaces.
                              super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              spaces.
                              super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>
                              ._M_impl.super__Vector_impl_data._M_start._0_4_));
  CheckXrResult(XVar5,
                "xrEnumerateReferenceSpaces(m_session, spaceCount, &spaceCount, spaces.data())",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:323"
               );
  Fmt_abi_cxx11_((string *)&createInfo,"Available reference spaces: %d",(ulong)spaceCount);
  Log::Write(Info,(string *)&createInfo);
  std::__cxx11::string::~string((string *)&createInfo);
  pXVar3 = (XrReferenceSpaceType *)
           CONCAT44(spaces.
                    super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>.
                    _M_impl.super__Vector_impl_data._M_finish._4_4_,
                    spaces.
                    super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>.
                    _M_impl.super__Vector_impl_data._M_finish._0_4_);
  for (pXVar9 = (XrReferenceSpaceType *)
                CONCAT44(spaces.
                         super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         spaces.
                         super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_4_); pXVar9 != pXVar3;
      pXVar9 = pXVar9 + 1) {
    pcVar7 = to_string(*pXVar9);
    Fmt_abi_cxx11_((string *)&createInfo,"  Name: %s",pcVar7);
    Log::Write(Verbose,(string *)&createInfo);
    std::__cxx11::string::~string((string *)&createInfo);
  }
  std::_Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>::~_Vector_base
            (&spaces.super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>
            );
  memset(&createInfo,0,0xd8);
  createInfo.type = XR_TYPE_ACTION_SET_CREATE_INFO;
  createInfo.createFlags._0_1_ = 'g';
  createInfo.createFlags._1_1_ = 'a';
  createInfo.createFlags._2_1_ = 'm';
  createInfo.createFlags._3_1_ = 'e';
  createInfo.createFlags._4_1_ = 'p';
  createInfo.createFlags._5_1_ = 'l';
  createInfo.createFlags._6_1_ = 'a';
  createInfo.createFlags._7_1_ = 'y';
  createInfo.systemId = 0;
  local_138 = (XrAction)0x0;
  uStack_130._0_4_ = 0.0;
  uStack_130._4_4_ = 0.0;
  local_128 = (XrAction)0x0;
  uStack_120 = 0;
  local_118 = (XrAction)0x0;
  uStack_110 = 0;
  memcpy(&local_108,"Gameplay",0x80);
  XVar5 = xrCreateActionSet(this->m_instance,&createInfo);
  CheckXrResult(XVar5,"xrCreateActionSet(m_instance, &actionSetInfo, &m_input.actionSet)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:350"
               );
  paVar2 = &(this->m_input).handSubactionPath;
  XVar5 = xrStringToPath(this->m_instance,"/user/hand/left",paVar2);
  CheckXrResult(XVar5,
                "xrStringToPath(m_instance, \"/user/hand/left\", &m_input.handSubactionPath[Side::LEFT])"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:354"
               );
  XVar5 = xrStringToPath(this->m_instance,"/user/hand/right",
                         (this->m_input).handSubactionPath._M_elems + 1);
  CheckXrResult(XVar5,
                "xrStringToPath(m_instance, \"/user/hand/right\", &m_input.handSubactionPath[Side::RIGHT])"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:355"
               );
  createInfo.next = (void *)0x0;
  createInfo.type = XR_TYPE_ACTION_CREATE_INFO;
  createInfo._4_4_ = 0;
  local_108 = (XrAction)CONCAT44(local_108._4_4_,2);
  createInfo.createFlags._0_1_ = 'g';
  createInfo.createFlags._1_1_ = 'r';
  createInfo.createFlags._2_1_ = 'a';
  createInfo.createFlags._3_1_ = 'b';
  createInfo.createFlags._4_1_ = '_';
  createInfo.createFlags._5_1_ = 'o';
  createInfo.createFlags._6_1_ = 'b';
  createInfo.createFlags._7_1_ = 'j';
  createInfo.systemId = 0x746365;
  local_138 = (XrAction)0x0;
  uStack_130._0_4_ = 0.0;
  uStack_130._4_4_ = 0.0;
  local_128 = (XrAction)0x0;
  uStack_120 = 0;
  local_118 = (XrAction)0x0;
  uStack_110 = 0;
  memcpy((string *)&local_f8,"Grab Object",0x80);
  local_108._4_4_ = 2;
  local_100 = paVar2;
  XVar5 = xrCreateAction((this->m_input).actionSet,&createInfo,&(this->m_input).grabAction);
  CheckXrResult(XVar5,"xrCreateAction(m_input.actionSet, &actionInfo, &m_input.grabAction)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:366"
               );
  local_108 = (XrAction)CONCAT44(local_108._4_4_,4);
  createInfo.createFlags._0_1_ = 'h';
  createInfo.createFlags._1_1_ = 'a';
  createInfo.createFlags._2_1_ = 'n';
  createInfo.createFlags._3_1_ = 'd';
  createInfo.createFlags._4_1_ = '_';
  createInfo.createFlags._5_1_ = 'p';
  createInfo.createFlags._6_1_ = 'o';
  createInfo.createFlags._7_1_ = 's';
  createInfo.systemId = 0x65;
  local_138 = (XrAction)0x0;
  uStack_130._0_4_ = 0.0;
  uStack_130._4_4_ = 0.0;
  local_128 = (XrAction)0x0;
  uStack_120 = 0;
  local_118 = (XrAction)0x0;
  uStack_110 = 0;
  memcpy((string *)&local_f8,"Hand Pose",0x80);
  local_108._4_4_ = 2;
  local_100 = paVar2;
  XVar5 = xrCreateAction((this->m_input).actionSet,&createInfo,&(this->m_input).poseAction);
  CheckXrResult(XVar5,"xrCreateAction(m_input.actionSet, &actionInfo, &m_input.poseAction)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:374"
               );
  local_108 = (XrAction)CONCAT44(local_108._4_4_,100);
  createInfo.createFlags._0_1_ = 'v';
  createInfo.createFlags._1_1_ = 'i';
  createInfo.createFlags._2_1_ = 'b';
  createInfo.createFlags._3_1_ = 'r';
  createInfo.createFlags._4_1_ = 'a';
  createInfo.createFlags._5_1_ = 't';
  createInfo.createFlags._6_1_ = 'e';
  createInfo.createFlags._7_1_ = '_';
  createInfo.systemId = 0x646e6168;
  local_138 = (XrAction)0x0;
  uStack_130._0_4_ = 0.0;
  uStack_130._4_4_ = 0.0;
  local_128 = (XrAction)0x0;
  uStack_120 = 0;
  local_118 = (XrAction)0x0;
  uStack_110 = 0;
  memcpy((string *)&local_f8,"Vibrate Hand",0x80);
  local_108._4_4_ = 2;
  local_100 = paVar2;
  XVar5 = xrCreateAction((this->m_input).actionSet,&createInfo,&(this->m_input).vibrateAction);
  CheckXrResult(XVar5,"xrCreateAction(m_input.actionSet, &actionInfo, &m_input.vibrateAction)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:382"
               );
  local_108 = (XrAction)CONCAT44(local_108._4_4_,1);
  createInfo.createFlags._0_1_ = 'q';
  createInfo.createFlags._1_1_ = 'u';
  createInfo.createFlags._2_1_ = 'i';
  createInfo.createFlags._3_1_ = 't';
  createInfo.createFlags._4_1_ = '_';
  createInfo.createFlags._5_1_ = 's';
  createInfo.createFlags._6_1_ = 'e';
  createInfo.createFlags._7_1_ = 's';
  createInfo.systemId = 0x6e6f6973;
  local_138 = (XrAction)0x0;
  uStack_130._0_4_ = 0.0;
  uStack_130._4_4_ = 0.0;
  local_128 = (XrAction)0x0;
  uStack_120 = 0;
  local_118 = (XrAction)0x0;
  uStack_110 = 0;
  memcpy((string *)&local_f8,"Quit Session",0x80);
  local_108 = (XrAction)((ulong)local_108 & 0xffffffff);
  local_100 = (array<unsigned_long,_2UL> *)0x0;
  XVar5 = xrCreateAction((this->m_input).actionSet,&createInfo,&(this->m_input).quitAction);
  CheckXrResult(XVar5,"xrCreateAction(m_input.actionSet, &actionInfo, &m_input.quitAction)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:392"
               );
  XVar5 = xrStringToPath(this->m_instance,"/user/hand/left/input/select/click",&spaceCount);
  CheckXrResult(XVar5,
                "xrStringToPath(m_instance, \"/user/hand/left/input/select/click\", &selectPath[Side::LEFT])"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:404"
               );
  XVar5 = xrStringToPath(this->m_instance,"/user/hand/right/input/select/click",local_190);
  CheckXrResult(XVar5,
                "xrStringToPath(m_instance, \"/user/hand/right/input/select/click\", &selectPath[Side::RIGHT])"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:405"
               );
  XVar5 = xrStringToPath(this->m_instance,"/user/hand/left/input/squeeze/value",&squeezeValuePath);
  CheckXrResult(XVar5,
                "xrStringToPath(m_instance, \"/user/hand/left/input/squeeze/value\", &squeezeValuePath[Side::LEFT])"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:406"
               );
  XVar5 = xrStringToPath(this->m_instance,"/user/hand/right/input/squeeze/value",
                         squeezeValuePath._M_elems + 1);
  CheckXrResult(XVar5,
                "xrStringToPath(m_instance, \"/user/hand/right/input/squeeze/value\", &squeezeValuePath[Side::RIGHT])"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:407"
               );
  XVar5 = xrStringToPath(this->m_instance,"/user/hand/left/input/squeeze/force",&squeezeForcePath);
  CheckXrResult(XVar5,
                "xrStringToPath(m_instance, \"/user/hand/left/input/squeeze/force\", &squeezeForcePath[Side::LEFT])"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:408"
               );
  XVar5 = xrStringToPath(this->m_instance,"/user/hand/right/input/squeeze/force",
                         squeezeForcePath._M_elems + 1);
  CheckXrResult(XVar5,
                "xrStringToPath(m_instance, \"/user/hand/right/input/squeeze/force\", &squeezeForcePath[Side::RIGHT])"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:409"
               );
  XVar5 = xrStringToPath(this->m_instance,"/user/hand/left/input/squeeze/click",&squeezeClickPath);
  CheckXrResult(XVar5,
                "xrStringToPath(m_instance, \"/user/hand/left/input/squeeze/click\", &squeezeClickPath[Side::LEFT])"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:410"
               );
  XVar5 = xrStringToPath(this->m_instance,"/user/hand/right/input/squeeze/click",
                         squeezeClickPath._M_elems + 1);
  CheckXrResult(XVar5,
                "xrStringToPath(m_instance, \"/user/hand/right/input/squeeze/click\", &squeezeClickPath[Side::RIGHT])"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:411"
               );
  XVar5 = xrStringToPath(this->m_instance,"/user/hand/left/input/grip/pose",&posePath);
  CheckXrResult(XVar5,
                "xrStringToPath(m_instance, \"/user/hand/left/input/grip/pose\", &posePath[Side::LEFT])"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:412"
               );
  XVar5 = xrStringToPath(this->m_instance,"/user/hand/right/input/grip/pose",posePath._M_elems + 1);
  CheckXrResult(XVar5,
                "xrStringToPath(m_instance, \"/user/hand/right/input/grip/pose\", &posePath[Side::RIGHT])"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:413"
               );
  XVar5 = xrStringToPath(this->m_instance,"/user/hand/left/output/haptic",&hapticPath);
  CheckXrResult(XVar5,
                "xrStringToPath(m_instance, \"/user/hand/left/output/haptic\", &hapticPath[Side::LEFT])"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:414"
               );
  XVar5 = xrStringToPath(this->m_instance,"/user/hand/right/output/haptic",hapticPath._M_elems + 1);
  CheckXrResult(XVar5,
                "xrStringToPath(m_instance, \"/user/hand/right/output/haptic\", &hapticPath[Side::RIGHT])"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:415"
               );
  XVar5 = xrStringToPath(this->m_instance,"/user/hand/left/input/menu/click",&menuClickPath);
  CheckXrResult(XVar5,
                "xrStringToPath(m_instance, \"/user/hand/left/input/menu/click\", &menuClickPath[Side::LEFT])"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:416"
               );
  XVar5 = xrStringToPath(this->m_instance,"/user/hand/right/input/menu/click",
                         menuClickPath._M_elems + 1);
  CheckXrResult(XVar5,
                "xrStringToPath(m_instance, \"/user/hand/right/input/menu/click\", &menuClickPath[Side::RIGHT])"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:417"
               );
  XVar5 = xrStringToPath(this->m_instance,"/user/hand/left/input/b/click",&bClickPath);
  CheckXrResult(XVar5,
                "xrStringToPath(m_instance, \"/user/hand/left/input/b/click\", &bClickPath[Side::LEFT])"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:418"
               );
  XVar5 = xrStringToPath(this->m_instance,"/user/hand/right/input/b/click",bClickPath._M_elems + 1);
  CheckXrResult(XVar5,
                "xrStringToPath(m_instance, \"/user/hand/right/input/b/click\", &bClickPath[Side::RIGHT])"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:419"
               );
  XVar5 = xrStringToPath(this->m_instance,"/user/hand/left/input/trigger/value",&triggerValuePath);
  CheckXrResult(XVar5,
                "xrStringToPath(m_instance, \"/user/hand/left/input/trigger/value\", &triggerValuePath[Side::LEFT])"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:420"
               );
  XVar5 = xrStringToPath(this->m_instance,"/user/hand/right/input/trigger/value",
                         triggerValuePath._M_elems + 1);
  CheckXrResult(XVar5,
                "xrStringToPath(m_instance, \"/user/hand/right/input/trigger/value\", &triggerValuePath[Side::RIGHT])"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:421"
               );
  XVar5 = xrStringToPath(this->m_instance,"/interaction_profiles/khr/simple_controller",
                         &khrSimpleInteractionProfilePath);
  CheckXrResult(XVar5,
                "xrStringToPath(m_instance, \"/interaction_profiles/khr/simple_controller\", &khrSimpleInteractionProfilePath)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:426"
               );
  createInfo._0_8_ = (this->m_input).grabAction;
  createInfo.systemId = local_190[0];
  local_138 = (this->m_input).poseAction;
  uStack_130 = posePath._M_elems[0];
  uStack_120 = posePath._M_elems[1];
  local_118 = (this->m_input).quitAction;
  uStack_110 = menuClickPath._M_elems[0];
  local_100 = (array<unsigned_long,_2UL> *)menuClickPath._M_elems[1];
  local_f8 = (this->m_input).vibrateAction;
  local_f0 = hapticPath._M_elems[0];
  local_e0 = hapticPath._M_elems[1];
  __l._M_len = 8;
  __l._M_array = (iterator)&createInfo;
  createInfo.createFlags = createInfo._0_8_;
  local_128 = local_138;
  local_108 = local_118;
  local_e8 = local_f8;
  std::vector<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_>::vector
            ((vector<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_> *)&spaces,
             __l,&local_241);
  createInfo.next = (void *)0x0;
  createInfo.type = XR_TYPE_INTERACTION_PROFILE_SUGGESTED_BINDING;
  createInfo._4_4_ = 0;
  createInfo.createFlags = khrSimpleInteractionProfilePath;
  createInfo.systemId =
       (ulong)(CONCAT44(spaces.
                        super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>
                        ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                        spaces.
                        super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>
                        ._M_impl.super__Vector_impl_data._M_finish._0_4_) -
              CONCAT44(spaces.
                       super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>
                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                       spaces.
                       super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>
                       ._M_impl.super__Vector_impl_data._M_start._0_4_)) >> 4 & 0xffffffff;
  XVar5 = xrSuggestInteractionProfileBindings(this->m_instance);
  CheckXrResult(XVar5,"xrSuggestInteractionProfileBindings(m_instance, &suggestedBindings)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:440"
               );
  std::_Vector_base<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_>::
  ~_Vector_base((_Vector_base<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_> *
                )&spaces);
  XVar5 = xrStringToPath(this->m_instance,"/interaction_profiles/oculus/touch_controller",
                         &khrSimpleInteractionProfilePath);
  CheckXrResult(XVar5,
                "xrStringToPath(m_instance, \"/interaction_profiles/oculus/touch_controller\", &oculusTouchInteractionProfilePath)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:446"
               );
  createInfo._0_8_ = (this->m_input).grabAction;
  createInfo.next = (void *)squeezeValuePath._M_elems[0];
  createInfo.systemId = squeezeValuePath._M_elems[1];
  local_138 = (this->m_input).poseAction;
  uStack_130 = posePath._M_elems[0];
  uStack_120 = posePath._M_elems[1];
  local_118 = (this->m_input).quitAction;
  uStack_110 = menuClickPath._M_elems[0];
  local_108 = (this->m_input).vibrateAction;
  local_100 = (array<unsigned_long,_2UL> *)hapticPath._M_elems[0];
  local_f0 = hapticPath._M_elems[1];
  __l_00._M_len = 7;
  __l_00._M_array = (iterator)&createInfo;
  createInfo.createFlags = createInfo._0_8_;
  local_128 = local_138;
  local_f8 = local_108;
  std::vector<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_>::vector
            ((vector<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_> *)&spaces,
             __l_00,&local_241);
  createInfo.next = (void *)0x0;
  createInfo.type = XR_TYPE_INTERACTION_PROFILE_SUGGESTED_BINDING;
  createInfo._4_4_ = 0;
  createInfo.createFlags = khrSimpleInteractionProfilePath;
  createInfo.systemId =
       (ulong)(CONCAT44(spaces.
                        super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>
                        ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                        spaces.
                        super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>
                        ._M_impl.super__Vector_impl_data._M_finish._0_4_) -
              CONCAT44(spaces.
                       super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>
                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                       spaces.
                       super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>
                       ._M_impl.super__Vector_impl_data._M_start._0_4_)) >> 4 & 0xffffffff;
  XVar5 = xrSuggestInteractionProfileBindings(this->m_instance);
  CheckXrResult(XVar5,"xrSuggestInteractionProfileBindings(m_instance, &suggestedBindings)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:458"
               );
  std::_Vector_base<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_>::
  ~_Vector_base((_Vector_base<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_> *
                )&spaces);
  XVar5 = xrStringToPath(this->m_instance,"/interaction_profiles/htc/vive_controller",
                         &khrSimpleInteractionProfilePath);
  CheckXrResult(XVar5,
                "xrStringToPath(m_instance, \"/interaction_profiles/htc/vive_controller\", &viveControllerInteractionProfilePath)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:464"
               );
  createInfo._0_8_ = (this->m_input).grabAction;
  createInfo.next = (void *)triggerValuePath._M_elems[0];
  createInfo.systemId = triggerValuePath._M_elems[1];
  local_138 = (this->m_input).poseAction;
  uStack_130 = posePath._M_elems[0];
  uStack_120 = posePath._M_elems[1];
  local_118 = (this->m_input).quitAction;
  uStack_110 = menuClickPath._M_elems[0];
  local_100 = (array<unsigned_long,_2UL> *)menuClickPath._M_elems[1];
  local_f8 = (this->m_input).vibrateAction;
  local_f0 = hapticPath._M_elems[0];
  local_e0 = hapticPath._M_elems[1];
  __l_01._M_len = 8;
  __l_01._M_array = (iterator)&createInfo;
  createInfo.createFlags = createInfo._0_8_;
  local_128 = local_138;
  local_108 = local_118;
  local_e8 = local_f8;
  std::vector<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_>::vector
            ((vector<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_> *)&spaces,
             __l_01,&local_241);
  createInfo.next = (void *)0x0;
  createInfo.type = XR_TYPE_INTERACTION_PROFILE_SUGGESTED_BINDING;
  createInfo._4_4_ = 0;
  createInfo.createFlags = khrSimpleInteractionProfilePath;
  createInfo.systemId =
       (ulong)(CONCAT44(spaces.
                        super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>
                        ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                        spaces.
                        super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>
                        ._M_impl.super__Vector_impl_data._M_finish._0_4_) -
              CONCAT44(spaces.
                       super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>
                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                       spaces.
                       super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>
                       ._M_impl.super__Vector_impl_data._M_start._0_4_)) >> 4 & 0xffffffff;
  XVar5 = xrSuggestInteractionProfileBindings(this->m_instance);
  CheckXrResult(XVar5,"xrSuggestInteractionProfileBindings(m_instance, &suggestedBindings)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:477"
               );
  std::_Vector_base<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_>::
  ~_Vector_base((_Vector_base<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_> *
                )&spaces);
  XVar5 = xrStringToPath(this->m_instance,"/interaction_profiles/valve/index_controller",
                         &khrSimpleInteractionProfilePath);
  CheckXrResult(XVar5,
                "xrStringToPath(m_instance, \"/interaction_profiles/valve/index_controller\", &indexControllerInteractionProfilePath)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:484"
               );
  createInfo._0_8_ = (this->m_input).grabAction;
  createInfo.next = (void *)squeezeForcePath._M_elems[0];
  createInfo.systemId = squeezeForcePath._M_elems[1];
  local_138 = (this->m_input).poseAction;
  uStack_130 = posePath._M_elems[0];
  uStack_120 = posePath._M_elems[1];
  local_118 = (this->m_input).quitAction;
  uStack_110 = bClickPath._M_elems[0];
  local_100 = (array<unsigned_long,_2UL> *)bClickPath._M_elems[1];
  local_f8 = (this->m_input).vibrateAction;
  local_f0 = hapticPath._M_elems[0];
  local_e0 = hapticPath._M_elems[1];
  __l_02._M_len = 8;
  __l_02._M_array = (iterator)&createInfo;
  createInfo.createFlags = createInfo._0_8_;
  local_128 = local_138;
  local_108 = local_118;
  local_e8 = local_f8;
  std::vector<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_>::vector
            ((vector<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_> *)&spaces,
             __l_02,&local_241);
  createInfo.next = (void *)0x0;
  createInfo.type = XR_TYPE_INTERACTION_PROFILE_SUGGESTED_BINDING;
  createInfo._4_4_ = 0;
  createInfo.createFlags = khrSimpleInteractionProfilePath;
  createInfo.systemId =
       (ulong)(CONCAT44(spaces.
                        super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>
                        ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                        spaces.
                        super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>
                        ._M_impl.super__Vector_impl_data._M_finish._0_4_) -
              CONCAT44(spaces.
                       super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>
                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                       spaces.
                       super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>
                       ._M_impl.super__Vector_impl_data._M_start._0_4_)) >> 4 & 0xffffffff;
  XVar5 = xrSuggestInteractionProfileBindings(this->m_instance);
  CheckXrResult(XVar5,"xrSuggestInteractionProfileBindings(m_instance, &suggestedBindings)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:497"
               );
  std::_Vector_base<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_>::
  ~_Vector_base((_Vector_base<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_> *
                )&spaces);
  XVar5 = xrStringToPath(this->m_instance,"/interaction_profiles/microsoft/motion_controller",
                         &khrSimpleInteractionProfilePath);
  CheckXrResult(XVar5,
                "xrStringToPath(m_instance, \"/interaction_profiles/microsoft/motion_controller\", &microsoftMixedRealityInteractionProfilePath)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:504"
               );
  createInfo._0_8_ = (this->m_input).grabAction;
  createInfo.next = (void *)squeezeClickPath._M_elems[0];
  createInfo.systemId = squeezeClickPath._M_elems[1];
  local_138 = (this->m_input).poseAction;
  uStack_130 = posePath._M_elems[0];
  uStack_120 = posePath._M_elems[1];
  local_118 = (this->m_input).quitAction;
  uStack_110 = menuClickPath._M_elems[0];
  local_100 = (array<unsigned_long,_2UL> *)menuClickPath._M_elems[1];
  local_f8 = (this->m_input).vibrateAction;
  local_f0 = hapticPath._M_elems[0];
  local_e0 = hapticPath._M_elems[1];
  __l_03._M_len = 8;
  __l_03._M_array = (iterator)&createInfo;
  createInfo.createFlags = createInfo._0_8_;
  local_128 = local_138;
  local_108 = local_118;
  local_e8 = local_f8;
  std::vector<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_>::vector
            ((vector<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_> *)&spaces,
             __l_03,&local_241);
  createInfo.next = (void *)0x0;
  createInfo.type = XR_TYPE_INTERACTION_PROFILE_SUGGESTED_BINDING;
  createInfo._4_4_ = 0;
  createInfo.createFlags = khrSimpleInteractionProfilePath;
  createInfo.systemId =
       (ulong)(CONCAT44(spaces.
                        super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>
                        ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                        spaces.
                        super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>
                        ._M_impl.super__Vector_impl_data._M_finish._0_4_) -
              CONCAT44(spaces.
                       super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>
                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                       spaces.
                       super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>
                       ._M_impl.super__Vector_impl_data._M_start._0_4_)) >> 4 & 0xffffffff;
  XVar5 = xrSuggestInteractionProfileBindings(this->m_instance);
  CheckXrResult(XVar5,"xrSuggestInteractionProfileBindings(m_instance, &suggestedBindings)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:517"
               );
  std::_Vector_base<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_>::
  ~_Vector_base((_Vector_base<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_> *
                )&spaces);
  createInfo.next = (void *)0x0;
  local_128 = (XrAction)0x0;
  uStack_120 = 0;
  local_138 = (XrAction)0x0;
  createInfo.type = XR_TYPE_ACTION_SPACE_CREATE_INFO;
  createInfo._4_4_ = 0;
  createInfo.createFlags = (XrSessionCreateFlags)(this->m_input).poseAction;
  uStack_130._0_4_ = 0.0;
  uStack_130._4_4_ = 1.0;
  createInfo.systemId = (this->m_input).handSubactionPath._M_elems[0];
  XVar5 = xrCreateActionSpace(this->m_session,&createInfo,&(this->m_input).handSpace);
  CheckXrResult(XVar5,
                "xrCreateActionSpace(m_session, &actionSpaceInfo, &m_input.handSpace[Side::LEFT])",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:523"
               );
  createInfo.systemId = (this->m_input).handSubactionPath._M_elems[1];
  XVar5 = xrCreateActionSpace(this->m_session,&createInfo,(this->m_input).handSpace._M_elems + 1);
  CheckXrResult(XVar5,
                "xrCreateActionSpace(m_session, &actionSpaceInfo, &m_input.handSpace[Side::RIGHT])",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:525"
               );
  spaces.super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x3c;
  spaces.super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  spaces.super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  spaces.super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  spaces.super__Vector_base<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
  XVar5 = xrAttachSessionActionSets(this->m_session,&spaces);
  CheckXrResult(XVar5,"xrAttachSessionActionSets(m_session, &attachInfo)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:530"
               );
  if (this->m_session != (XrSession)0x0) {
    std::__cxx11::string::string((string *)&createInfo,"ViewFront",(allocator *)&spaces);
    std::__cxx11::string::string((string *)&local_138,"Local",(allocator *)&spaceCount);
    std::__cxx11::string::string((string *)&local_118,"Stage",(allocator *)&squeezeValuePath);
    std::__cxx11::string::string((string *)&local_f8,"StageLeft",(allocator *)&squeezeForcePath);
    std::__cxx11::string::string(local_d8,"StageRight",(allocator *)&squeezeClickPath);
    std::__cxx11::string::string(local_b8,"StageLeftRotated",(allocator *)&posePath);
    std::__cxx11::string::string(local_98,"StageRightRotated",(allocator *)&hapticPath);
    for (lVar8 = 0; lVar8 != 0xe0; lVar8 = lVar8 + 0x20) {
      referenceSpaceTypeStr = (string *)((long)&createInfo.type + lVar8);
      GetXrReferenceSpaceCreateInfo((XrReferenceSpaceCreateInfo *)&spaces,referenceSpaceTypeStr);
      uVar6 = xrCreateReferenceSpace
                        (*ppXVar1,(XrReferenceSpaceCreateInfo *)&spaces,&squeezeValuePath);
      if ((int)uVar6 < 0) {
        Fmt_abi_cxx11_((string *)&spaceCount,"Failed to create reference space %s with error %d",
                       (referenceSpaceTypeStr->_M_dataplus)._M_p,(ulong)uVar6);
        Log::Write(Warning,(string *)&spaceCount);
        std::__cxx11::string::~string((string *)&spaceCount);
      }
      else {
        std::vector<XrSpace_T_*,_std::allocator<XrSpace_T_*>_>::push_back
                  (&this->m_visualizedSpaces,(value_type *)&squeezeValuePath);
      }
    }
    lVar8 = 0xc0;
    do {
      std::__cxx11::string::~string((string *)((long)&createInfo.type + lVar8));
      lVar8 = lVar8 + -0x20;
    } while (lVar8 != -0x20);
    GetXrReferenceSpaceCreateInfo
              ((XrReferenceSpaceCreateInfo *)&createInfo,
               &((this->m_options).super___shared_ptr<const_Options,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->AppSpace);
    XVar5 = xrCreateReferenceSpace
                      (this->m_session,(XrReferenceSpaceCreateInfo *)&createInfo,&this->m_appSpace);
    CheckXrResult(XVar5,"xrCreateReferenceSpace(m_session, &referenceSpaceCreateInfo, &m_appSpace)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:571"
                 );
    return;
  }
  std::__cxx11::string::string((string *)&createInfo,"Check failed",(allocator *)&spaces);
  Throw((string *)&createInfo,"m_session != XR_NULL_HANDLE",
        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:534"
       );
}

Assistant:

void InitializeSession() override {
        CHECK(m_instance != XR_NULL_HANDLE);
        CHECK(m_session == XR_NULL_HANDLE);

        {
            Log::Write(Log::Level::Verbose, Fmt("Creating session..."));

            XrSessionCreateInfo createInfo{XR_TYPE_SESSION_CREATE_INFO};
            createInfo.next = m_graphicsPlugin->GetGraphicsBinding();
            createInfo.systemId = m_systemId;
            CHECK_XRCMD(xrCreateSession(m_instance, &createInfo, &m_session));
        }

        LogReferenceSpaces();
        InitializeActions();
        CreateVisualizedSpaces();

        {
            XrReferenceSpaceCreateInfo referenceSpaceCreateInfo = GetXrReferenceSpaceCreateInfo(m_options->AppSpace);
            CHECK_XRCMD(xrCreateReferenceSpace(m_session, &referenceSpaceCreateInfo, &m_appSpace));
        }
    }